

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DemoScripts.cpp
# Opt level: O1

float NormedCustomLoss2(vector<INeuron_*,_std::allocator<INeuron_*>_> *outputNeurons,Target classId,
                       vector<float,_std::allocator<float>_> *deltas)

{
  pointer ppIVar1;
  INeuron *this;
  iterator __position;
  pointer pfVar2;
  int iVar3;
  pointer ppIVar4;
  long lVar5;
  long lVar6;
  ulong uVar7;
  ulong uVar8;
  vector<INeuron_*,_std::allocator<INeuron_*>_> *__range1;
  uint uVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float local_4c;
  undefined1 local_48 [16];
  
  ppIVar1 = (outputNeurons->super__Vector_base<INeuron_*,_std::allocator<INeuron_*>_>)._M_impl.
            super__Vector_impl_data._M_finish;
  uVar7 = 0;
  for (ppIVar4 = (outputNeurons->super__Vector_base<INeuron_*,_std::allocator<INeuron_*>_>)._M_impl.
                 super__Vector_impl_data._M_start; ppIVar4 != ppIVar1; ppIVar4 = ppIVar4 + 1) {
    this = *ppIVar4;
    iVar3 = INeuron::GetOutputSpikeCounter(this);
    if (uVar7 < (ulong)(long)iVar3) {
      iVar3 = INeuron::GetOutputSpikeCounter(this);
      uVar7 = (ulong)iVar3;
    }
  }
  ppIVar4 = (outputNeurons->super__Vector_base<INeuron_*,_std::allocator<INeuron_*>_>)._M_impl.
            super__Vector_impl_data._M_start;
  fVar10 = 0.0;
  if ((outputNeurons->super__Vector_base<INeuron_*,_std::allocator<INeuron_*>_>)._M_impl.
      super__Vector_impl_data._M_finish != ppIVar4) {
    fVar10 = 0.0;
    uVar8 = 0;
    do {
      uVar9 = -(uint)(ABS(classId - (float)(int)uVar8) < 1e-05);
      fVar11 = 0.0;
      if (uVar7 != 0) {
        local_48 = ZEXT416(uVar9);
        iVar3 = INeuron::GetOutputSpikeCounter(ppIVar4[uVar8]);
        fVar11 = (float)iVar3 / (float)uVar7;
        uVar9 = local_48._0_4_;
      }
      local_4c = fVar11 - (float)(uVar9 & 0x3f800000);
      __position._M_current =
           (deltas->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
           super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (deltas->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<float,_std::allocator<float>_>::_M_realloc_insert<float>
                  (deltas,__position,&local_4c);
      }
      else {
        *__position._M_current = local_4c;
        (deltas->super__Vector_base<float,_std::allocator<float>_>)._M_impl.super__Vector_impl_data.
        _M_finish = __position._M_current + 1;
      }
      fVar11 = (deltas->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
               super__Vector_impl_data._M_finish[-1];
      fVar10 = fVar10 + fVar11 * fVar11;
      uVar8 = uVar8 + 1;
      ppIVar4 = (outputNeurons->super__Vector_base<INeuron_*,_std::allocator<INeuron_*>_>)._M_impl.
                super__Vector_impl_data._M_start;
    } while (uVar8 < (ulong)((long)(outputNeurons->
                                   super__Vector_base<INeuron_*,_std::allocator<INeuron_*>_>).
                                   _M_impl.super__Vector_impl_data._M_finish - (long)ppIVar4 >> 3));
  }
  if (fVar10 < 0.0) {
    fVar10 = sqrtf(fVar10);
  }
  else {
    fVar10 = SQRT(fVar10);
  }
  fVar11 = 0.0;
  if ((1e-05 < fVar10) &&
     (lVar5 = (long)(outputNeurons->super__Vector_base<INeuron_*,_std::allocator<INeuron_*>_>).
                    _M_impl.super__Vector_impl_data._M_finish -
              (long)(outputNeurons->super__Vector_base<INeuron_*,_std::allocator<INeuron_*>_>).
                    _M_impl.super__Vector_impl_data._M_start, fVar11 = 0.0, lVar5 != 0)) {
    lVar5 = lVar5 >> 3;
    pfVar2 = (deltas->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
             super__Vector_impl_data._M_start;
    lVar6 = 0;
    fVar11 = 0.0;
    do {
      fVar12 = pfVar2[lVar6] / fVar10;
      pfVar2[lVar6] = fVar12;
      fVar11 = fVar12 * fVar12 * 0.5 + fVar11;
      lVar6 = lVar6 + 1;
    } while (lVar5 + (ulong)(lVar5 == 0) != lVar6);
  }
  return -fVar11;
}

Assistant:

float
NormedCustomLoss2( const std::vector<INeuron *> &outputNeurons, SPIKING_NN::Target classId, std::vector<float> &deltas )
{
    float loss = 0;
    size_t maxSpikes = 0;
    float s = 0;
    for ( auto neuron: outputNeurons ) {
        if ( neuron->GetOutputSpikeCounter() > maxSpikes ) {
            maxSpikes = neuron->GetOutputSpikeCounter();
        }
    }
    for ( int neuronId = 0; neuronId < outputNeurons.size(); neuronId++ ) {
        INeuron *neuron = outputNeurons[neuronId];
        auto target = static_cast<float>( abs( classId - neuronId ) < SPIKING_NN::EPS );
        float output = maxSpikes ? static_cast<float>(neuron->GetOutputSpikeCounter()) / maxSpikes : 0;
        deltas.emplace_back( output - target );
        s += deltas.back() * deltas.back();
    }
    s = sqrt( s );
    if ( s > SPIKING_NN::EPS ) {
        for ( int neuronId = 0; neuronId < outputNeurons.size(); neuronId++ ) {
            deltas[neuronId] = deltas[neuronId] / s;
            loss += 0.5 * ( deltas[neuronId] * deltas[neuronId] );
        }
    }
    return -loss;
}